

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApprovalTestNamer.cpp
# Opt level: O0

string * __thiscall
ApprovalTests::ApprovalTestNamer::getReceivedFile(ApprovalTestNamer *this,string *extensionWithDot)

{
  string *in_RDI;
  string *in_stack_00000198;
  string *in_stack_000001a0;
  ApprovalTestNamer *in_stack_000001a8;
  allocator local_39;
  string local_38 [56];
  
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_38,".received",&local_39);
  getFullFileName(in_stack_000001a8,in_stack_000001a0,in_stack_00000198);
  ::std::__cxx11::string::~string(local_38);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_39);
  return in_RDI;
}

Assistant:

std::string ApprovalTestNamer::getReceivedFile(std::string extensionWithDot) const
    {

        return getFullFileName(".received", extensionWithDot);
    }